

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O2

bool __thiscall USBControlTransferParser::ParseStringDescriptor(USBControlTransferParser *this)

{
  USBAnalyzerResults *pUVar1;
  int iVar2;
  int iVar3;
  string utf8_string_descriptor;
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  convert;
  
  if ((char)(this->mRequest).wValue == '\0') {
    iVar2 = this->mParsedOffset;
    while ((iVar3 = this->mDescBytes, iVar2 < iVar3 &&
           (this->mPacketOffset < this->mPacketDataBytes))) {
      pUVar1 = this->pResults;
      USBPacket::GetDataPayloadField
                ((USBPacket *)&convert,(int)this->pPacket,this->mPacketOffset,'\x02',
                 (char *)(ulong)this->mAddress,0x13b33d,'\x12');
      AnalyzerResults::AddFrame((Frame *)pUVar1);
      Frame::~Frame((Frame *)&convert);
      this->mPacketOffset = this->mPacketOffset + 2;
      iVar2 = this->mParsedOffset + 2;
      this->mParsedOffset = iVar2;
    }
  }
  else {
    iVar2 = this->mParsedOffset;
    if (iVar2 == 2) {
      (this->utf16StringDescriptor)._M_string_length = 0;
      *(this->utf16StringDescriptor)._M_dataplus._M_p = L'\0';
    }
    while ((iVar3 = this->mDescBytes, iVar2 < iVar3 &&
           (this->mPacketOffset < this->mPacketDataBytes))) {
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      push_back(&this->utf16StringDescriptor,
                *(char16_t *)
                 ((this->pPacket->mData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start + (long)this->mPacketOffset + 2));
      pUVar1 = this->pResults;
      USBPacket::GetDataPayloadField
                ((USBPacket *)&convert,(int)this->pPacket,this->mPacketOffset,'\x02',
                 (char *)(ulong)this->mAddress,0x13b345,'\x1b');
      AnalyzerResults::AddFrame((Frame *)pUVar1);
      Frame::~Frame((Frame *)&convert);
      this->mPacketOffset = this->mPacketOffset + 2;
      iVar2 = this->mParsedOffset + 2;
      this->mParsedOffset = iVar2;
    }
    if (iVar3 == iVar2) {
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::wstring_convert(&convert);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::to_bytes(&utf8_string_descriptor,&convert,&this->utf16StringDescriptor);
      USBAnalyzerResults::AddStringDescriptor
                (this->pResults,(uint)this->mAddress,(uint)(byte)(this->mRequest).wValue,
                 &utf8_string_descriptor);
      std::__cxx11::string::~string((string *)&utf8_string_descriptor);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::~wstring_convert(&convert);
      iVar3 = this->mDescBytes;
      iVar2 = this->mParsedOffset;
    }
  }
  return iVar3 == iVar2;
}

Assistant:

bool USBControlTransferParser::ParseStringDescriptor()
{
    // if this is a supported language table desriptor or actual string descriptor
    if( mRequest.GetRequestedDescriptorIndex() == 0 )
    {
        while( mDescBytes > mParsedOffset && mPacketDataBytes > mPacketOffset )
        {
            pResults->AddFrame( pPacket->GetDataPayloadField( mPacketOffset, 2, mAddress, "wLANGID", Fld_wLANGID ) );
            mPacketOffset += 2;
            mParsedOffset += 2;
        }
    }
    else
    {
        if( mParsedOffset == 2 )
            utf16StringDescriptor.clear();

        // the actual UNICODE string
        while( mDescBytes > mParsedOffset && mPacketDataBytes > mPacketOffset )
        {
            char16_t code_unit = static_cast<char16_t>( pPacket->GetDataPayload( mPacketOffset, 2 ) );
            utf16StringDescriptor.push_back( code_unit );

            pResults->AddFrame( pPacket->GetDataPayloadField( mPacketOffset, 2, mAddress, "wchar", Fld_Wchar ) );
            mPacketOffset += 2;
            mParsedOffset += 2;
        }

        // do we have the entire string?
        if( mDescBytes == mParsedOffset )
        {
            std::wstring_convert<std::codecvt_utf8_utf16<char16_t>, char16_t> convert;
            std::string utf8_string_descriptor = convert.to_bytes( utf16StringDescriptor );
            pResults->AddStringDescriptor( mAddress, mRequest.GetRequestedDescriptorIndex(), utf8_string_descriptor );
        }
    }
    // return true if we've finished parsing the string descriptor, according to the parsed bLength
    return mDescBytes == mParsedOffset;
}